

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O1

void ABC_Dump_Bench_File(ABC_Manager mng)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  char *pFileName;
  
  pNtk = Abc_NtkStrash(mng->pNtk,0,0,0);
  pNtk_00 = Abc_NtkToNetlistBench(pNtk);
  Abc_NtkDelete(pNtk);
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    pFileName = "abc_test.bench";
    if (mng->pDumpFileName != (char *)0x0) {
      pFileName = mng->pDumpFileName;
    }
    Io_WriteBench(pNtk_00,pFileName);
    Abc_NtkDelete(pNtk_00);
    return;
  }
  puts("ABC_Dump_Bench_File: Dumping BENCH has failed.");
  return;
}

Assistant:

void ABC_Dump_Bench_File( ABC_Manager mng )
{
    Abc_Ntk_t * pNtkTemp, * pNtkAig;
    const char * pFileName;
 
    // derive the netlist
    pNtkAig = Abc_NtkStrash( mng->pNtk, 0, 0, 0 );
    pNtkTemp = Abc_NtkToNetlistBench( pNtkAig );
    Abc_NtkDelete( pNtkAig );
    if ( pNtkTemp == NULL ) 
        { printf( "ABC_Dump_Bench_File: Dumping BENCH has failed.\n" ); return; }
    pFileName = mng->pDumpFileName? mng->pDumpFileName: "abc_test.bench";
    Io_WriteBench( pNtkTemp, pFileName );
    Abc_NtkDelete( pNtkTemp );
}